

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::ValidateFileOptions
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  long lVar1;
  FileOptions *pFVar2;
  string *element_name;
  Type *proto_00;
  Type *proto_01;
  Type *proto_02;
  Type *proto_03;
  FileOptions *pFVar3;
  long *plVar4;
  size_type *psVar5;
  long lVar6;
  long lVar7;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (0 < *(int *)(file + 0x58)) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      lVar1 = *(long *)(file + 0x60);
      proto_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                           (&(proto->message_type_).super_RepeatedPtrFieldBase,(int)lVar7);
      ValidateMessageOptions(this,(Descriptor *)(lVar1 + lVar6),proto_00);
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0xa8;
    } while (lVar7 < *(int *)(file + 0x58));
  }
  if (0 < *(int *)(file + 0x68)) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      lVar1 = *(long *)(file + 0x70);
      proto_01 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                           (&(proto->enum_type_).super_RepeatedPtrFieldBase,(int)lVar7);
      ValidateEnumOptions(this,(EnumDescriptor *)(lVar1 + lVar6),proto_01);
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x38;
    } while (lVar7 < *(int *)(file + 0x68));
  }
  if (0 < *(int *)(file + 0x78)) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      lVar1 = *(long *)(file + 0x80);
      proto_02 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                           (&(proto->service_).super_RepeatedPtrFieldBase,(int)lVar7);
      ValidateServiceOptions(this,(ServiceDescriptor *)(lVar1 + lVar6),proto_02);
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x30;
    } while (lVar7 < *(int *)(file + 0x78));
  }
  if (0 < *(int *)(file + 0x88)) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      lVar1 = *(long *)(file + 0x98);
      proto_03 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                           (&(proto->extension_).super_RepeatedPtrFieldBase,(int)lVar7);
      ValidateFieldOptions(this,(FieldDescriptor *)(lVar1 + lVar6),proto_03);
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0xa8;
    } while (lVar7 < *(int *)(file + 0x88));
  }
  pFVar2 = *(FileOptions **)(file + 0xa0);
  pFVar3 = FileOptions::default_instance();
  if (((pFVar2 == pFVar3) || (*(int *)(*(long *)(file + 0xa0) + 0xa8) != 3)) &&
     (0 < *(int *)(file + 0x18))) {
    lVar6 = 0;
    do {
      if (*(GoogleOnceDynamic **)(file + 0x30) != (GoogleOnceDynamic *)0x0) {
        GoogleOnceDynamic::Init<google::protobuf::FileDescriptor_const>
                  (*(GoogleOnceDynamic **)(file + 0x30),FileDescriptor::DependenciesOnceInit,file);
      }
      lVar7 = *(long *)(*(long *)(file + 0x20) + lVar6 * 8);
      if (lVar7 != 0) {
        pFVar2 = *(FileOptions **)(lVar7 + 0xa0);
        pFVar3 = FileOptions::default_instance();
        if ((pFVar2 != pFVar3) && (*(int *)(*(long *)(lVar7 + 0xa0) + 0xa8) == 3)) {
          element_name = *(string **)file;
          if (*(GoogleOnceDynamic **)(file + 0x30) != (GoogleOnceDynamic *)0x0) {
            GoogleOnceDynamic::Init<google::protobuf::FileDescriptor_const>
                      (*(GoogleOnceDynamic **)(file + 0x30),FileDescriptor::DependenciesOnceInit,
                       file);
          }
          std::operator+(&local_50,
                         "Files that do not use optimize_for = LITE_RUNTIME cannot import files which do use this option.  This file is not lite, but it imports \""
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          **(undefined8 **)(*(long *)(file + 0x20) + lVar6 * 8));
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
          psVar5 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_70.field_2._M_allocated_capacity = *psVar5;
            local_70.field_2._8_8_ = plVar4[3];
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          }
          else {
            local_70.field_2._M_allocated_capacity = *psVar5;
            local_70._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_70._M_string_length = plVar4[1];
          *plVar4 = (long)psVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          AddError(this,element_name,&proto->super_Message,OTHER,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          break;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < *(int *)(file + 0x18));
  }
  if (*(int *)(file + 0x8c) == 3) {
    ValidateProto3(this,file,proto);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateFileOptions(FileDescriptor* file,
                                            const FileDescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(file, message_type, Message);
  VALIDATE_OPTIONS_FROM_ARRAY(file, enum_type, Enum);
  VALIDATE_OPTIONS_FROM_ARRAY(file, service, Service);
  VALIDATE_OPTIONS_FROM_ARRAY(file, extension, Field);

  // Lite files can only be imported by other Lite files.
  if (!IsLite(file)) {
    for (int i = 0; i < file->dependency_count(); i++) {
      if (IsLite(file->dependency(i))) {
        AddError(
          file->name(), proto,
          DescriptorPool::ErrorCollector::OTHER,
          "Files that do not use optimize_for = LITE_RUNTIME cannot import "
          "files which do use this option.  This file is not lite, but it "
          "imports \"" + file->dependency(i)->name() + "\" which is.");
        break;
      }
    }
  }
  if (file->syntax() == FileDescriptor::SYNTAX_PROTO3) {
    ValidateProto3(file, proto);
  }
}